

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetTracerExpCreatePrologue
          (ZETParameterValidation *this,zet_context_handle_t hContext,zet_tracer_exp_desc_t *desc,
          zet_tracer_exp_handle_t *phTracer)

{
  ze_result_t zVar1;
  
  if (hContext == (zet_context_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (((desc != (zet_tracer_exp_desc_t *)0x0) && (phTracer != (zet_tracer_exp_handle_t *)0x0)) &&
     (desc->pUserData != (void *)0x0)) {
    zVar1 = ParameterValidation::validateExtensions<_zet_tracer_exp_desc_t_const*>(desc);
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetTracerExpCreatePrologue(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        const zet_tracer_exp_desc_t* desc,              ///< [in] pointer to tracer descriptor
        zet_tracer_exp_handle_t* phTracer               ///< [out] pointer to handle of tracer object created
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == desc->pUserData )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phTracer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ParameterValidation::validateExtensions(desc);
    }